

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::WideStringToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,wchar_t *str,int num_chars)

{
  bool bVar1;
  size_t sVar2;
  uint32_t extraout_EDX;
  uint32_t code_point;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  string local_1e0;
  uint local_1b0;
  int local_1ac;
  uint32_t unicode_code_point;
  int i;
  stringstream stream;
  int num_chars_local;
  wchar_t *str_local;
  
  stream._388_4_ = SUB84(str,0);
  if (stream._388_4_ == -1) {
    sVar2 = wcslen((wchar_t *)this);
    stream._388_4_ = SUB84(sVar2,0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&unicode_code_point);
  local_1ac = 0;
  code_point = extraout_EDX;
  while ((local_1ac < (int)stream._388_4_ && (*(int *)(this + (long)local_1ac * 4) != 0))) {
    if ((local_1ac + 1 < (int)stream._388_4_) &&
       (bVar1 = IsUtf16SurrogatePair
                          (*(wchar_t *)(this + (long)local_1ac * 4),
                           *(wchar_t *)(this + (long)local_1ac * 4 + 4)),
       code_point = extraout_EDX_00, bVar1)) {
      local_1b0 = CreateCodePointFromUtf16SurrogatePair
                            (*(wchar_t *)(this + (long)local_1ac * 4),
                             *(wchar_t *)(this + (long)local_1ac * 4 + 4));
      local_1ac = local_1ac + 1;
      code_point = extraout_EDX_01;
    }
    else {
      local_1b0 = *(uint *)(this + (long)local_1ac * 4);
    }
    CodePointToUtf8_abi_cxx11_(&local_1e0,(internal *)(ulong)local_1b0,code_point);
    std::operator<<((ostream *)&stream.field_0x8,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_1ac = local_1ac + 1;
    code_point = extraout_EDX_02;
  }
  StringStreamToString(__return_storage_ptr__,(stringstream *)&unicode_code_point);
  std::__cxx11::stringstream::~stringstream((stringstream *)&unicode_code_point);
  return __return_storage_ptr__;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    uint32_t unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<uint32_t>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}